

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatcoe.c
# Opt level: O0

int ecx_readODdescription(ecx_contextt *context,uint16 Item,ec_ODlistt *pODlist)

{
  ushort slave;
  uint8 uVar1;
  int iVar2;
  uint8 local_838 [6];
  uint8 uStack_832;
  uint8 cnt;
  ec_mbxbuft MbxOut;
  ec_mbxbuft MbxIn;
  uint16 Slave;
  uint16 n;
  int wkc;
  ec_SDOservicet *aSDOp;
  ec_SDOservicet *SDOp;
  ec_ODlistt *pODlist_local;
  uint16 Item_local;
  ecx_contextt *context_local;
  
  slave = pODlist->Slave;
  pODlist->DataType[Item] = 0;
  pODlist->ObjectCode[Item] = '\0';
  pODlist->MaxSub[Item] = '\0';
  pODlist->Name[Item][0] = '\0';
  ec_clearmbx((ec_mbxbuft *)(MbxOut + 0x3f8));
  ecx_mbxreceive(context,slave,(ec_mbxbuft *)(MbxOut + 0x3f8),0);
  ec_clearmbx((ec_mbxbuft *)local_838);
  local_838[0] = '\b';
  local_838[1] = '\0';
  local_838[2] = '\0';
  local_838[3] = '\0';
  local_838[4] = '\0';
  uVar1 = ec_nextmbxcnt(context->slavelist[slave].mbx_cnt);
  context->slavelist[slave].mbx_cnt = uVar1;
  local_838[5] = uVar1 * '\x10' + '\x03';
  uStack_832 = '\0';
  cnt = 0x80;
  MbxOut[0] = '\x03';
  MbxOut[1] = '\0';
  MbxOut[2] = '\0';
  MbxOut[3] = '\0';
  MbxOut._4_2_ = pODlist->Index[Item];
  MbxIn._1020_4_ = ecx_mbxsend(context,slave,(ec_mbxbuft *)local_838,20000);
  if (0 < (int)MbxIn._1020_4_) {
    ec_clearmbx((ec_mbxbuft *)(MbxOut + 0x3f8));
    MbxIn._1020_4_ = ecx_mbxreceive(context,slave,(ec_mbxbuft *)(MbxOut + 0x3f8),700000);
    if (0 < (int)MbxIn._1020_4_) {
      if (((MbxOut[0x3fd] & 0xf) == 3) && ((MbxIn[0] & 0x7f) == 4)) {
        MbxIn._1018_2_ = MbxOut._1016_2_ - 0xc;
        if (0x28 < (ushort)MbxIn._1018_2_) {
          MbxIn[0x3fa] = '(';
          MbxIn[0x3fb] = '\0';
        }
        pODlist->DataType[Item] = MbxIn._6_2_;
        pODlist->ObjectCode[Item] = MbxIn[9];
        pODlist->MaxSub[Item] = MbxIn[8];
        strncpy(pODlist->Name[Item],(char *)(MbxIn + 10),(ulong)(ushort)MbxIn._1018_2_);
        pODlist->Name[Item][(ushort)MbxIn._1018_2_] = '\0';
      }
      else {
        if ((MbxIn[0] & 0x7f) == 7) {
          ecx_SDOinfoerror(context,slave,pODlist->Index[Item],'\0',MbxIn._4_4_);
        }
        else {
          ecx_packeterror(context,slave,pODlist->Index[Item],'\0',1);
        }
        MbxIn[0x3fc] = '\0';
        MbxIn[0x3fd] = '\0';
        MbxIn[0x3fe] = '\0';
        MbxIn[0x3ff] = '\0';
      }
    }
  }
  iVar2._0_1_ = MbxIn[0x3fc];
  iVar2._1_1_ = MbxIn[0x3fd];
  iVar2._2_1_ = MbxIn[0x3fe];
  iVar2._3_1_ = MbxIn[0x3ff];
  return iVar2;
}

Assistant:

int ecx_readODdescription(ecx_contextt *context, uint16 Item, ec_ODlistt *pODlist)
{
   ec_SDOservicet *SDOp, *aSDOp;
   int wkc;
   uint16  n, Slave;
   ec_mbxbuft MbxIn, MbxOut;
   uint8 cnt;

   Slave = pODlist->Slave;
   pODlist->DataType[Item] = 0;
   pODlist->ObjectCode[Item] = 0;
   pODlist->MaxSub[Item] = 0;
   pODlist->Name[Item][0] = 0;
   ec_clearmbx(&MbxIn);
   /* clear pending out mailbox in slave if available. Timeout is set to 0 */
   wkc = ecx_mbxreceive(context, Slave, &MbxIn, 0);
   ec_clearmbx(&MbxOut);
   aSDOp = (ec_SDOservicet*)&MbxIn;
   SDOp = (ec_SDOservicet*)&MbxOut;
   SDOp->MbxHeader.length = htoes(0x0008);
   SDOp->MbxHeader.address = htoes(0x0000);
   SDOp->MbxHeader.priority = 0x00;
   /* Get new mailbox counter value */
   cnt = ec_nextmbxcnt(context->slavelist[Slave].mbx_cnt);
   context->slavelist[Slave].mbx_cnt = cnt;
   SDOp->MbxHeader.mbxtype = ECT_MBXT_COE + (cnt << 4); /* CoE */
   SDOp->CANOpen = htoes(0x000 + (ECT_COES_SDOINFO << 12)); /* number 9bits service upper 4 bits */
   SDOp->Opcode = ECT_GET_OD_REQ; /* get object description request */
   SDOp->Reserved = 0;
   SDOp->Fragments = 0; /* fragments left */
   SDOp->wdata[0] = htoes(pODlist->Index[Item]); /* Data of Index */
   /* send get object description request to slave */
   wkc = ecx_mbxsend(context, Slave, &MbxOut, EC_TIMEOUTTXM);
   /* mailbox placed in slave ? */
   if (wkc > 0)
   {
      ec_clearmbx(&MbxIn);
      /* read slave response */
      wkc = ecx_mbxreceive(context, Slave, &MbxIn, EC_TIMEOUTRXM);
      /* got response ? */
      if (wkc > 0)
      {
         if (((aSDOp->MbxHeader.mbxtype & 0x0f) == ECT_MBXT_COE) &&
             ((aSDOp->Opcode & 0x7f) == ECT_GET_OD_RES))
         {
            n = (etohs(aSDOp->MbxHeader.length) - 12); /* length of string(name of object) */
            if (n > EC_MAXNAME)
            {
               n = EC_MAXNAME; /* max chars */
            }
            pODlist->DataType[Item] = etohs(aSDOp->wdata[1]);
            pODlist->ObjectCode[Item] = aSDOp->bdata[5];
            pODlist->MaxSub[Item] = aSDOp->bdata[4];

            strncpy(pODlist->Name[Item] , (char *)&aSDOp->bdata[6], n);
            pODlist->Name[Item][n] = 0x00; /* String terminator */
         }
         /* got unexpected response from slave */
         else
         {
            if (((aSDOp->Opcode & 0x7f) == ECT_SDOINFO_ERROR)) /* SDO info error received */
            {
               ecx_SDOinfoerror(context, Slave,pODlist->Index[Item], 0, etohl(aSDOp->ldata[0]));
            }
            else
            {
               ecx_packeterror(context, Slave,pODlist->Index[Item], 0, 1); /* Unexpected frame returned */
            }
            wkc = 0;
         }
      }
   }
  
   return wkc;
}